

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_base.cpp
# Opt level: O0

int __thiscall zmq::session_base_t::write_zap_msg(session_base_t *this,msg_t *msg_)

{
  byte bVar1;
  int iVar2;
  ulong uVar3;
  int *piVar4;
  char *pcVar5;
  size_t in_RCX;
  void *in_RDX;
  EVP_PKEY_CTX *in_RSI;
  EVP_PKEY_CTX *ctx;
  pipe_t *in_RDI;
  char *errstr;
  int rc;
  int local_4;
  
  if ((in_RDI[4]._msgs_read == 0) ||
     (ctx = in_RSI, uVar3 = pipe_t::write((pipe_t *)in_RDI[4]._msgs_read,(int)in_RSI,in_RDX,in_RCX),
     (uVar3 & 1) == 0)) {
    piVar4 = __errno_location();
    *piVar4 = 0x6b;
    local_4 = -1;
  }
  else {
    bVar1 = msg_t::flags((msg_t *)in_RSI);
    if ((bVar1 & 1) == 0) {
      pipe_t::flush(in_RDI);
    }
    iVar2 = msg_t::init((msg_t *)in_RSI,ctx);
    if (iVar2 != 0) {
      piVar4 = __errno_location();
      pcVar5 = strerror(*piVar4);
      fprintf(_stderr,"%s (%s:%d)\n",pcVar5,
              "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/session_base.cpp"
              ,0xe1);
      fflush(_stderr);
      zmq_abort((char *)0x302cbc);
    }
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int zmq::session_base_t::write_zap_msg (msg_t *msg_)
{
    if (_zap_pipe == NULL || !_zap_pipe->write (msg_)) {
        errno = ENOTCONN;
        return -1;
    }

    if ((msg_->flags () & msg_t::more) == 0)
        _zap_pipe->flush ();

    const int rc = msg_->init ();
    errno_assert (rc == 0);
    return 0;
}